

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

bool __thiscall
google::protobuf::Reflection::InsertOrLookupMapValue
          (Reflection *this,Message *message,FieldDescriptor *field,MapKey *key,MapValueRef *val)

{
  bool bVar1;
  undefined1 uVar2;
  CppType CVar3;
  uint32_t uVar4;
  Descriptor *this_00;
  FieldDescriptor *this_01;
  allocator local_59;
  MapKey *local_58;
  string local_50;
  
  local_58 = key;
  bVar1 = FieldDescriptor::is_map(field);
  if (!bVar1) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"\"InsertOrLookupMapValue\"","Field is not a map field.");
  }
  this_00 = FieldDescriptor::message_type(field);
  std::__cxx11::string::string((string *)&local_50,"value",&local_59);
  this_01 = Descriptor::FindFieldByName(this_00,&local_50);
  CVar3 = FieldDescriptor::cpp_type(this_01);
  (val->super_MapValueConstRef).type_ = CVar3;
  std::__cxx11::string::~string((string *)&local_50);
  uVar4 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
  uVar2 = (**(code **)(*(long *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                                (ulong)uVar4) + 0x18))
                    ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4,local_58,
                     val);
  return (bool)uVar2;
}

Assistant:

bool Reflection::InsertOrLookupMapValue(Message* message,
                                        const FieldDescriptor* field,
                                        const MapKey& key,
                                        MapValueRef* val) const {
  USAGE_CHECK(IsMapFieldInApi(field), "InsertOrLookupMapValue",
              "Field is not a map field.");
  val->SetType(field->message_type()->FindFieldByName("value")->cpp_type());
  return MutableRaw<MapFieldBase>(message, field)
      ->InsertOrLookupMapValue(key, val);
}